

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  ulong uVar1;
  pointer pcVar2;
  impl_string_type *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  error_category *peVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  error_category *peVar10;
  path *ppVar11;
  path *extraout_RAX;
  format fVar12;
  time_t *lwt;
  bool bVar13;
  path target;
  path work;
  path pe;
  file_status sls;
  file_status fs;
  iterator __begin3;
  iterator __end3;
  path local_1b8;
  error_code *local_198;
  uint local_18c;
  error_category *local_188;
  error_category *local_180;
  error_category local_178 [16];
  path *local_168;
  path local_160;
  error_category *local_140;
  error_category *local_138;
  undefined1 local_130 [32];
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char local_d0 [16];
  iterator local_c0;
  iterator local_78;
  
  if ((p->_path)._M_string_length == 0) {
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  sVar7 = path::root_name_length(p);
  uVar1 = (p->_path)._M_string_length;
  if ((sVar7 < uVar1) && ((p->_path)._M_dataplus._M_p[sVar7] == '/')) {
    local_130._0_8_ = local_130 + 0x10;
    pcVar2 = (p->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)local_130,pcVar2,pcVar2 + uVar1);
  }
  else {
    absolute((path *)local_130,p,ec);
  }
  local_1b8._path._M_dataplus._M_p = (pointer)((long)&local_1b8 + 0x10);
  local_1b8._path._M_string_length = 0;
  local_1b8._path.field_2._M_local_buf[0] = '\0';
  peVar8 = (error_category *)0x0;
  lwt = (time_t *)0x0;
  detail::status_ex((path *)(local_f0 + 8),(error_code *)local_130,(file_status *)ec,
                    (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
  local_168 = __return_storage_ptr__;
  if (ec->_M_value == 0) {
    if (local_f0._8_4_ != 1) {
      local_140 = (error_category *)&(__return_storage_ptr__->_path).field_2;
      local_198 = ec;
      do {
        sVar7 = path::root_name_length((path *)local_130);
        peVar10 = (error_category *)path::root_name_length((path *)local_130);
        if (peVar10 < (ulong)local_130._8_8_) {
          local_138 = (error_category *)
                      (ulong)(*(error_category *)(local_130._0_8_ + (long)peVar10) ==
                             (error_category)0x2f);
          peVar8 = (error_category *)local_130._0_8_;
        }
        else {
          local_138 = (error_category *)0x0;
        }
        local_1b8._path._M_string_length = 0;
        *local_1b8._path._M_dataplus._M_p = '\0';
        local_78._first._M_current = (char *)local_130._0_8_;
        path::iterator::iterator(&local_c0,(path *)local_130,&local_78._first);
        local_188 = (error_category *)(local_130._0_8_ + local_130._8_8_);
        path::iterator::iterator(&local_78,(path *)local_130,(const_iterator *)&local_188);
        local_138 = (error_category *)((long)local_138 + sVar7);
        local_18c = 0;
        while (local_c0._iter._M_current != local_78._iter._M_current) {
          local_110 = local_100;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_c0._current._path._M_dataplus._M_p,
                     local_c0._current._path._M_dataplus._M_p +
                     local_c0._current._path._M_string_length);
          lVar4 = local_108;
          if (local_108 == 0) {
            bVar13 = true;
          }
          else {
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,".","");
            local_e0._M_allocated_capacity = (size_type)local_d0;
            peVar10 = local_188;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_e0,local_188,local_180 + (long)local_188);
            fVar12 = (format)peVar10;
            if (local_188 != local_178) {
              operator_delete(local_188);
            }
            path::postprocess_path_with_format((path *)&local_e0,fVar12);
            iVar5 = path::compare((path *)&local_110,(path *)&local_e0);
            bVar13 = iVar5 == 0;
          }
          if ((lVar4 != 0) && ((char *)local_e0._M_allocated_capacity != local_d0)) {
            operator_delete((void *)local_e0._M_allocated_capacity);
          }
          iVar5 = 5;
          if (!bVar13) {
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"..","");
            local_160._path._M_dataplus._M_p = (pointer)&local_160._path.field_2;
            peVar10 = local_188;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_160,local_188,local_180 + (long)local_188);
            fVar12 = (format)peVar10;
            if (local_188 != local_178) {
              operator_delete(local_188);
            }
            path::postprocess_path_with_format(&local_160,fVar12);
            iVar6 = path::compare((path *)&local_110,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._path._M_dataplus._M_p != &local_160._path.field_2) {
              operator_delete(local_160._path._M_dataplus._M_p);
            }
            if (iVar6 == 0) {
              path::parent_path((path *)&local_188,&local_1b8);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_188);
              if (local_188 != local_178) {
                operator_delete(local_188);
              }
            }
            else {
              operator/(&local_160,&local_1b8,(path *)&local_110);
              local_188 = local_178;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_188,local_160._path._M_dataplus._M_p,
                         local_160._path._M_dataplus._M_p + local_160._path._M_string_length);
              peVar10 = local_180;
              if (local_188 != local_178) {
                operator_delete(local_188);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._path._M_dataplus._M_p != &local_160._path.field_2) {
                operator_delete(local_160._path._M_dataplus._M_p);
              }
              if (local_138 < peVar10) {
                operator/((path *)&local_188,&local_1b8,(path *)&local_110);
                detail::symlink_status_ex
                          ((path *)local_f0,(error_code *)&local_188,(uintmax_t *)local_198,
                           (uintmax_t *)peVar8,lwt);
                if (local_188 != local_178) {
                  operator_delete(local_188);
                }
                if (local_198->_M_value == 0) {
                  if (local_f0._0_4_ == 4) {
                    operator/(&local_160,&local_1b8,(path *)&local_110);
                    read_symlink((path *)&local_188,&local_160,local_198);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._path._M_dataplus._M_p != &local_160._path.field_2) {
                      operator_delete(local_160._path._M_dataplus._M_p);
                    }
                    if (local_198->_M_value == 0) {
                      peVar10 = (error_category *)path::root_name_length((path *)&local_188);
                      if ((peVar10 < local_180) &&
                         (peVar8 = local_188, local_188[(long)peVar10] == (error_category)0x2f)) {
                        iVar5 = 5;
                        ppVar11 = (path *)std::__cxx11::string::_M_assign((string *)&local_1b8);
                      }
                      else {
                        iVar5 = 5;
                        ppVar11 = path::operator/=(&local_1b8,(path *)&local_188);
                      }
                    }
                    else {
                      (local_168->_path)._M_dataplus._M_p = (pointer)local_140;
                      (local_168->_path)._M_string_length = 0;
                      (local_168->_path).field_2._M_local_buf[0] = '\0';
                      iVar5 = 1;
                      ppVar11 = local_168;
                      peVar8 = local_140;
                    }
                    if (local_188 != local_178) {
                      operator_delete(local_188);
                      ppVar11 = extraout_RAX;
                    }
                    local_18c = (uint)CONCAT71((int7)((ulong)ppVar11 >> 8),1);
                  }
                  else {
                    iVar5 = 0;
                    path::operator/=(&local_1b8,(path *)&local_110);
                  }
                }
                else {
                  (local_168->_path)._M_dataplus._M_p = (pointer)local_140;
                  (local_168->_path)._M_string_length = 0;
                  (local_168->_path).field_2._M_local_buf[0] = '\0';
                  iVar5 = 1;
                  peVar8 = local_140;
                }
              }
              else {
                path::operator/=(&local_1b8,(path *)&local_110);
              }
            }
          }
          if (local_110 != local_100) {
            operator_delete(local_110);
          }
          if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_001afdd9;
          path::iterator::operator++(&local_c0);
        }
        iVar5 = 4;
LAB_001afdd9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2) {
          operator_delete(local_78._current._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._current._path._M_dataplus._M_p != &local_c0._current._path.field_2) {
          operator_delete(local_c0._current._path._M_dataplus._M_p);
        }
        if (iVar5 == 4) {
          iVar5 = 0;
          std::__cxx11::string::_M_assign((string *)local_130);
        }
        if (iVar5 != 0) goto LAB_001af8f0;
      } while ((local_18c & 1) != 0);
      peVar8 = (error_category *)std::_V2::system_category();
      local_198->_M_value = 0;
      local_198->_M_cat = peVar8;
      (local_168->_path)._M_dataplus._M_p = (pointer)local_140;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_1b8 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._path._M_dataplus._M_p == paVar9) {
        *(uintmax_t *)local_140 =
             CONCAT71(local_1b8._path.field_2._M_allocated_capacity._1_7_,
                      local_1b8._path.field_2._M_local_buf[0]);
        *(undefined8 *)(local_140 + 8) = local_1b8._path.field_2._8_8_;
      }
      else {
        (local_168->_path)._M_dataplus._M_p = local_1b8._path._M_dataplus._M_p;
        (local_168->_path).field_2._M_allocated_capacity =
             CONCAT71(local_1b8._path.field_2._M_allocated_capacity._1_7_,
                      local_1b8._path.field_2._M_local_buf[0]);
      }
      (local_168->_path)._M_string_length = local_1b8._path._M_string_length;
      piVar3 = &local_1b8._path;
      local_1b8._path._M_dataplus._M_p = (pointer)paVar9;
      goto LAB_001af8e6;
    }
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
  }
  paVar9 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar9;
  piVar3 = &__return_storage_ptr__->_path;
LAB_001af8e6:
  piVar3->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
LAB_001af8f0:
  if (local_1b8._path._M_dataplus._M_p != (pointer)((long)&local_1b8 + 0x10)) {
    operator_delete(local_1b8._path._M_dataplus._M_p);
  }
  ppVar11 = local_168;
  if ((error_category *)local_130._0_8_ != (error_category *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_);
  }
  return ppVar11;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}